

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::detail::IEEEFloat::makeSmallest(IEEEFloat *this,bool Negative)

{
  uint parts;
  integerPart *dst;
  bool Negative_local;
  IEEEFloat *this_local;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 2;
  this->field_0x12 = this->field_0x12 & 0xf7 | Negative << 3;
  this->exponent = this->semantics->minExponent;
  dst = significandParts(this);
  parts = partCount(this);
  APInt::tcSet(dst,1,parts);
  return;
}

Assistant:

void IEEEFloat::makeSmallest(bool Negative) {
  // We want (in interchange format):
  //   sign = {Negative}
  //   exponent = 0..0
  //   significand = 0..01
  category = fcNormal;
  sign = Negative;
  exponent = semantics->minExponent;
  APInt::tcSet(significandParts(), 1, partCount());
}